

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCU.cpp
# Opt level: O2

void __thiscall
kpeg::MCU::constructMCU
          (MCU *this,array<std::vector<int,_std::allocator<int>_>,_3UL> *compRLE,
          vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          *QTables)

{
  pointer piVar1;
  pointer piVar2;
  Level LVar3;
  Logger *pLVar4;
  ostream *poVar5;
  long lVar6;
  pair<const_int,_const_int> pVar7;
  int i_1;
  long lVar8;
  Level lvl;
  Level lvl_00;
  ulong uVar9;
  int compID;
  long lVar10;
  int iVar11;
  int i_2;
  array<int,_64UL> zzOrder;
  
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::operator=((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               *)&m_QTables,QTables);
  m_MCUCount = m_MCUCount + 1;
  pLVar4 = Logger::get();
  LVar3 = Logger::getLevel(pLVar4);
  if (1 < (int)LVar3) {
    pLVar4 = Logger::get();
    poVar5 = Logger::getStream(pLVar4);
    Logger::levelStr_abi_cxx11_((string *)&zzOrder,(Logger *)0x2,lvl);
    poVar5 = std::operator<<(poVar5,(string *)&zzOrder);
    poVar5 = std::operator<<(poVar5,"[ kpeg:");
    poVar5 = std::operator<<(poVar5,"MCU.cpp");
    poVar5 = std::operator<<(poVar5,":");
    *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x46);
    poVar5 = std::operator<<(poVar5," ] ");
    poVar5 = std::operator<<(poVar5,"Constructing MCU: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,m_MCUCount);
    poVar5 = std::operator<<(poVar5,"...");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&zzOrder);
  }
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 4) {
      *(undefined4 *)((long)zzOrder._M_elems + lVar6) = 0;
    }
    piVar1 = compRLE->_M_elems[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = compRLE->_M_elems[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar11 = -1;
    for (uVar9 = 0;
        (uVar9 <= ((long)piVar2 - (long)piVar1 >> 2) - 2U &&
        ((piVar1[uVar9] != 0 || (piVar1[uVar9 + 1] != 0)))); uVar9 = uVar9 + 2) {
      iVar11 = iVar11 + piVar1[uVar9] + 1;
      zzOrder._M_elems[iVar11] = piVar1[uVar9 + 1];
    }
    iVar11 = (&DCDiff)[lVar10];
    (&DCDiff)[lVar10] = iVar11 + zzOrder._M_elems[0];
    zzOrder._M_elems[0] = iVar11 + zzOrder._M_elems[0];
    lVar6 = *(long *)(m_QTables + (ulong)(lVar10 != 0) * 0x18);
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      zzOrder._M_elems[lVar8] = (uint)*(ushort *)(lVar6 + lVar8 * 2) * zzOrder._M_elems[lVar8];
    }
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      pVar7 = zzOrderToMatIndices((int)lVar6);
      (this->m_8x8block)._M_elems[lVar10]._M_elems[pVar7.first]._M_elems[(long)pVar7 >> 0x20] =
           zzOrder._M_elems[lVar6];
    }
  }
  computeIDCT(this);
  performLevelShift(this);
  convertYCbCrToRGB(this);
  pLVar4 = Logger::get();
  LVar3 = Logger::getLevel(pLVar4);
  if (1 < (int)LVar3) {
    pLVar4 = Logger::get();
    poVar5 = Logger::getStream(pLVar4);
    Logger::levelStr_abi_cxx11_((string *)&zzOrder,(Logger *)0x2,lvl_00);
    poVar5 = std::operator<<(poVar5,(string *)&zzOrder);
    poVar5 = std::operator<<(poVar5,"[ kpeg:");
    poVar5 = std::operator<<(poVar5,"MCU.cpp");
    poVar5 = std::operator<<(poVar5,":");
    *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x95);
    poVar5 = std::operator<<(poVar5," ] ");
    poVar5 = std::operator<<(poVar5,"Finished constructing MCU: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,m_MCUCount);
    poVar5 = std::operator<<(poVar5,"...");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&zzOrder);
  }
  return;
}

Assistant:

void MCU::constructMCU( const std::array<std::vector<int>, 3>& compRLE, const std::vector<std::vector<UInt16>>& QTables )
    {
        m_QTables = QTables;
        
        m_MCUCount++;
        
        LOG(Logger::Level::DEBUG) << "Constructing MCU: " << m_MCUCount << "..." << std::endl;
        
//         for ( auto&& rle : compRLE )
//         {
//             std::string rleStr = "";
//             for ( auto v = 0; v < rle.size(); v += 2 )
//             {
//                 std::stringstream ss;
//                 ss << "(" << rle[v] << ", " << rle[v + 1] << ") ";
//                 rleStr += ss.str();
//             }
//             
//             LOG(Logger::Level::DEBUG) << "RLE decoded data: " << rleStr << std::endl;
//         }
        
        const char* component[] = { "Y (Luminance)", "Cb (Chrominance)", "Cr (Chrominance)" };
        const char* type[] = { "DC", "AC" };    
        
        for ( int compID = 0; compID < 3; compID++ )
        {
            //LOG(Logger::Level::DEBUG) << "Constructing matrix for: MCU-" << m_MCUCount << ": " << component[compID] << "..." << std::endl;
            
            // Initialize with all zeros
            std::array<int, 64> zzOrder;            
            std::fill( zzOrder.begin(), zzOrder.end(), 0 );
            int j = -1;
            
            for ( auto i = 0; i <= compRLE[compID].size() - 2; i += 2 )
            {
                if ( compRLE[compID][i] == 0 && compRLE[compID][i + 1] == 0 )
                    break;
                
                j += compRLE[compID][i] + 1; // Skip the number of positions containing zeros
                zzOrder[j] = compRLE[compID][i + 1];
            }
            
            // DC_i = DC_i-1 + DC-difference
            DCDiff[compID] += zzOrder[0];
            zzOrder[0] = DCDiff[compID];
            
            int QIndex = compID == 0 ? 0 : 1;
            for ( auto i = 0; i < 64; ++i ) // !!!!!! i = 1
                zzOrder[i] *= m_QTables[QIndex][i];
            
            // Zig-zag order to 2D matrix order
            for ( auto i = 0; i < 64; ++i )
            {
                auto coords = zzOrderToMatIndices( i );
                
                m_8x8block[compID][ coords.first ][ coords.second ] = zzOrder[i];
            }
            
//             for ( auto&& row : m_8x8block[compID] )
//             {
//                 for ( auto&& val : row )
//                     std::cout << val << "\t";
//                 std::cout << std::endl;
//             }
//             std::cout << std::endl;

//             std::string matrix = "";
//             for ( auto&& row : m_8x8block[compID] )
//             {
//                 for ( auto&& val : row )
//                 {
//                     std::stringstream ss;
//                     ss << std::setw(7) << std::setfill(' ') << val << "";
//                     matrix += ss.str();
//                 }
//                 matrix += "\n";
//             }
//             
//             LOG(Logger::Level::DEBUG) << "DCT Matrix: " << component[compID] << ":-\n" << matrix << std::endl;
        }
        
        computeIDCT();
        performLevelShift();
        convertYCbCrToRGB();
        
        LOG(Logger::Level::DEBUG) << "Finished constructing MCU: " << m_MCUCount << "..." << std::endl;
    }